

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

ptrlen ntru_decode_ciphertext(uint16_t *ct,NTRUKeyPair *keypair,BinarySource *src)

{
  uint p;
  uint q;
  NTRUEncodeSchedule *sched;
  size_t wanted;
  ptrlen data;
  
  p = keypair->p;
  q = keypair->q;
  sched = ntru_encode_ciphertext_schedule(p,q);
  wanted = ntru_encode_schedule_length(sched);
  data = BinarySource_get_data(src->binarysource_,wanted);
  if (src->binarysource_->err == BSE_NO_ERROR) {
    ntru_decode(sched,ct,data);
    ntru_encode_schedule_free(sched);
    ntru_scale(ct,ct,3,p,q);
    ntru_bias(ct,ct,((q >> 1) + 1) % 3 + ~(q >> 1) + q,p,q);
  }
  else {
    memset(ct,0,(ulong)p * 2);
  }
  return data;
}

Assistant:

ptrlen ntru_decode_ciphertext(uint16_t *ct, NTRUKeyPair *keypair,
                              BinarySource *src)
{
    unsigned p = keypair->p, q = keypair->q;

    NTRUEncodeSchedule *sched = ntru_encode_ciphertext_schedule(p, q);

    /* Retrieve the right number of bytes from the source */
    size_t len = ntru_encode_schedule_length(sched);
    ptrlen encoded = get_data(src, len);
    if (get_err(src)) {
        /* As above, return deterministic nonsense on failure */
        memset(ct, 0, p*sizeof(*ct));
    } else {
        /* Do the decoding */
        ntru_decode(sched, ct, encoded);
        ntru_encode_schedule_free(sched);

        /* Undo the scaling and bias */
        ntru_scale(ct, ct, 3, p, q);
        ntru_bias(ct, ct, q - 3 * ciphertext_bias(q), p, q);
    }

    return encoded;        /* also useful to the caller, optionally */
}